

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O1

UBool ucase_addStringCaseClosure_63(UChar *s,int32_t length,USetAdder *sa)

{
  ushort uVar1;
  UBool UVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint c;
  int iVar9;
  
  UVar2 = '\0';
  if (0xfffffffd < length - 4U && s != (UChar *)0x0) {
    iVar8 = 0x49;
    iVar3 = 0;
    do {
      if (iVar8 <= iVar3) {
        return '\0';
      }
      iVar7 = (iVar3 + iVar8) / 2;
      lVar6 = (long)(iVar7 * 5) * 2 + 0x1ef2ca;
      lVar4 = 0;
      iVar5 = length + 1;
      do {
        if (*(ushort *)(lVar6 + lVar4) == 0) {
          iVar9 = 1;
          goto LAB_0018b843;
        }
        iVar9 = (uint)*(ushort *)((long)s + lVar4) - (uint)*(ushort *)(lVar6 + lVar4);
        if (iVar9 != 0) goto LAB_0018b843;
        lVar4 = lVar4 + 2;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
      iVar9 = 0;
      if (length != 3) {
        iVar9 = -(uint)(*(short *)(lVar6 + lVar4) != 0);
      }
LAB_0018b843:
      iVar5 = iVar3;
      if (iVar9 == 0) {
        iVar3 = 3;
        do {
          uVar1 = *(ushort *)(lVar6 + (long)iVar3 * 2);
          c = (uint)uVar1;
          if (uVar1 == 0) break;
          iVar7 = iVar3 + 1;
          if ((c & 0xfc00) == 0xd800) {
            c = (uint)uVar1 * 0x400 + (uint)*(ushort *)(lVar6 + (long)(iVar3 + 1) * 2) + 0xfca02400;
            iVar7 = iVar3 + 2;
          }
          iVar3 = iVar7;
          (*(code *)sa->add)(sa->set,c);
          ucase_addCaseClosure_63(c,sa);
        } while (iVar3 < 5);
      }
      else {
        if (iVar9 < 0) {
          iVar8 = iVar7;
        }
        iVar5 = iVar7 + 1;
        if (iVar9 < 0) {
          iVar5 = iVar3;
        }
      }
      iVar3 = iVar5;
    } while (iVar9 != 0);
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

U_CFUNC UBool U_EXPORT2
ucase_addStringCaseClosure(const UChar *s, int32_t length, const USetAdder *sa) {
    int32_t i, start, limit, result, unfoldRows, unfoldRowWidth, unfoldStringWidth;

    if(ucase_props_singleton.unfold==NULL || s==NULL) {
        return FALSE; /* no reverse case folding data, or no string */
    }
    if(length<=1) {
        /* the string is too short to find any match */
        /*
         * more precise would be:
         * if(!u_strHasMoreChar32Than(s, length, 1))
         * but this does not make much practical difference because
         * a single supplementary code point would just not be found
         */
        return FALSE;
    }

    const uint16_t *unfold=ucase_props_singleton.unfold;
    unfoldRows=unfold[UCASE_UNFOLD_ROWS];
    unfoldRowWidth=unfold[UCASE_UNFOLD_ROW_WIDTH];
    unfoldStringWidth=unfold[UCASE_UNFOLD_STRING_WIDTH];
    unfold+=unfoldRowWidth;

    if(length>unfoldStringWidth) {
        /* the string is too long to find any match */
        return FALSE;
    }

    /* do a binary search for the string */
    start=0;
    limit=unfoldRows;
    while(start<limit) {
        i=(start+limit)/2;
        const UChar *p=reinterpret_cast<const UChar *>(unfold+(i*unfoldRowWidth));
        result=strcmpMax(s, length, p, unfoldStringWidth);

        if(result==0) {
            /* found the string: add each code point, and its case closure */
            UChar32 c;

            for(i=unfoldStringWidth; i<unfoldRowWidth && p[i]!=0;) {
                U16_NEXT_UNSAFE(p, i, c);
                sa->add(sa->set, c);
                ucase_addCaseClosure(c, sa);
            }
            return TRUE;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return FALSE; /* string not found */
}